

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_sanguine_ward(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *txt;
  int charges;
  char *format;
  AFFECT_DATA af;
  
  charges = 1;
  iVar2 = charges;
  if ((*target_name != '\0') && (bVar1 = is_number(target_name), bVar1)) {
    iVar2 = atoi(target_name);
  }
  iVar3 = 5;
  if (iVar2 < 5) {
    iVar3 = iVar2;
  }
  if (1 < iVar3) {
    charges = iVar3;
  }
  bVar1 = drain_urn(ch,charges);
  if (!bVar1) {
    return;
  }
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    send_to_char("You are already warded.\n\r",ch);
    return;
  }
  init_affect(&af);
  af.where = 0;
  af.aftype = 0;
  af.location = 0;
  af.modifier = (short)charges;
  uVar4 = 7;
  if ((uint)(charges * 2) < 7) {
    uVar4 = charges * 2;
  }
  af.duration = (short)uVar4 + (short)(level / 5);
  af.type = (short)sn;
  af.level = (short)level;
  af.mod_name = 8;
  affect_to_char(ch,&af);
  send_to_char("Using the blood from your urn, you trace a symbol upon your forehead.\n\r",ch);
  send_to_char("A translucent red shield flickers into existence around you.\n\r",ch);
  act("$n dips a finger into $s urn and traces a symbol onto $s forehead.",ch,(void *)0x0,
      (void *)0x0,0);
  act("A translucent red shield flickers into existence around $n.",ch,(void *)0x0,(void *)0x0,0);
  if (iVar2 - 3U < 2) {
    format = 
    "The ward around $n seems nearly solid for a moment before fading back to translucence.";
    txt = "The strong ward seems nearly solid for a moment before fading back to translucence.\n\r";
  }
  else {
    if (iVar2 < 5) goto LAB_0030bee7;
    format = 
    "$n seems to flicker out of existence momentarily as the powerful ward coalesces around $m.";
    txt = 
    "Your surroundings seem to blur momentarily as the powerful ward coalesces around you.\n\r";
  }
  send_to_char(txt,ch);
  act(format,ch,(void *)0x0,(void *)0x0,0);
LAB_0030bee7:
  send_to_char("\n\r",ch);
  return;
}

Assistant:

void spell_sanguine_ward(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	int charges = 1;

	if (target_name[0] != '\0' && is_number(target_name))
		charges = atoi(target_name);

	charges = URANGE(1, charges, 5);

	if (!drain_urn(ch, charges))
		return;

	if (is_affected(ch, sn))
	{
		send_to_char("You are already warded.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.location = 0;
	af.modifier = charges;
	af.duration = level / 5 + std::min(charges * 2, 7);
	af.type = sn;
	af.level = level;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("Using the blood from your urn, you trace a symbol upon your forehead.\n\r", ch);
	send_to_char("A translucent red shield flickers into existence around you.\n\r", ch);

	act("$n dips a finger into $s urn and traces a symbol onto $s forehead.", ch, 0, 0, TO_ROOM);
	act("A translucent red shield flickers into existence around $n.", ch, 0, 0, TO_ROOM);

	if (charges > 2 && charges != 5)
	{
		send_to_char("The strong ward seems nearly solid for a moment before fading back to translucence.\n\r", ch);
		act("The ward around $n seems nearly solid for a moment before fading back to translucence.", ch, 0, 0, TO_ROOM);
	}

	if (charges == 5)
	{
		send_to_char("Your surroundings seem to blur momentarily as the powerful ward coalesces around you.\n\r", ch);
		act("$n seems to flicker out of existence momentarily as the powerful ward coalesces around $m.", ch, 0, 0, TO_ROOM);
	}

	send_to_char("\n\r", ch);
}